

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O2

void __thiscall PKCS12Test_TestPBES2_Test::TestBody(PKCS12Test_TestPBES2_Test *this)

{
  string data;
  string local_50;
  string local_30;
  
  GetTestData_abi_cxx11_(&local_50,"crypto/pkcs8/test/pbes2_sha1.p12");
  TestImpl("kPBES2WithSHA1",(Span<const_unsigned_char>)local_50._0_16_,"foo",(char *)0x0);
  GetTestData_abi_cxx11_(&local_30,"crypto/pkcs8/test/pbes2_sha256.p12");
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  TestImpl("kPBES2WithSHA256",(Span<const_unsigned_char>)local_50._0_16_,"foo",(char *)0x0);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

TEST(PKCS12Test, TestPBES2) {
  // pbes2_sha1.p12 is a PKCS#12 file using PBES2 and HMAC-SHA-1 created with:
  // openssl pkcs12 -export -inkey key.pem -in cert.pem -keypbe AES-128-CBC
  // -certpbe AES-128-CBC
  //
  // This was generated with an older OpenSSL, which used hmacWithSHA1 as the
  // PRF. (There is currently no way to specify the PRF in the pkcs12 command.)
  std::string data = GetTestData("crypto/pkcs8/test/pbes2_sha1.p12");
  TestImpl("kPBES2WithSHA1", bssl::StringAsBytes(data), kPassword, nullptr);

  // pbes2_sha256.p12 is a PKCS#12 file using PBES2 and HMAC-SHA-256. It was
  // generated in the same way as pbes2_sha1.p12, but using OpenSSL 1.1.1b,
  // which uses hmacWithSHA256 as the PRF.
  data = GetTestData("crypto/pkcs8/test/pbes2_sha256.p12");
  TestImpl("kPBES2WithSHA256", bssl::StringAsBytes(data), kPassword, nullptr);
}